

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Light.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Lighting_SpotLight(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pFVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  CX3DImporter_NodeElement_Light *pCVar6;
  allocator<char> local_141;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined4 local_e0;
  allocator<char> local_d9;
  undefined1 local_d8 [8];
  string an;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  float radius;
  float fStack_9c;
  bool on;
  aiVector3D location;
  float intensity;
  float fStack_88;
  bool global;
  aiVector3D direction;
  float cutOffAngle;
  aiColor3D color;
  float beamWidth;
  undefined1 local_60 [8];
  aiVector3D attenuation;
  float ambientIntensity;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&attenuation.z);
  attenuation.y = 0.0;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_60,1.0,0.0,0.0);
  color.g = 0.7854;
  aiColor3D::aiColor3D((aiColor3D *)&direction.z,1.0,1.0,1.0);
  direction.y = 1.570796;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&intensity,0.0,0.0,-1.0);
  location.z._3_1_ = 1;
  location.y = 1.0;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&radius,0.0,0.0,0.0);
  ne._7_1_ = 1;
  ne._0_4_ = 100.0;
  _idx_end = (CX3DImporter_NodeElement_Light *)0x0;
  an.field_2._12_4_ = 0;
  pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  an.field_2._8_4_ =
       (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)an.field_2._12_4_ < (int)an.field_2._8_4_; an.field_2._12_4_ = an.field_2._12_4_ + 1)
  {
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar4,(ulong)(uint)an.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,(char *)CONCAT44(extraout_var,iVar2),&local_d9);
    std::allocator<char>::~allocator(&local_d9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d8,"DEF");
    if (bVar1) {
      pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar4,(ulong)(uint)an.field_2._12_4_);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar2));
      local_e0 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d8,"USE");
      if (bVar1) {
        pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar4,(ulong)(uint)an.field_2._12_4_);
        std::__cxx11::string::operator=
                  ((string *)&attenuation.z,(char *)CONCAT44(extraout_var_01,iVar2));
        local_e0 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d8,"bboxCenter");
        if (bVar1) {
          local_e0 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8,"bboxSize");
          if (bVar1) {
            local_e0 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_d8,"containerField");
            if (bVar1) {
              local_e0 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_d8,"ambientIntensity");
              if (bVar1) {
                attenuation.y = XML_ReadNode_GetAttrVal_AsFloat(this,an.field_2._12_4_);
                local_e0 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_d8,"attenuation");
                if (bVar1) {
                  XML_ReadNode_GetAttrVal_AsVec3f(this,an.field_2._12_4_,(aiVector3D *)local_60);
                  local_e0 = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_d8,"beamWidth");
                  if (bVar1) {
                    color.g = XML_ReadNode_GetAttrVal_AsFloat(this,an.field_2._12_4_);
                    local_e0 = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_d8,"color");
                    if (bVar1) {
                      XML_ReadNode_GetAttrVal_AsCol3f
                                (this,an.field_2._12_4_,(aiColor3D *)&direction.z);
                      local_e0 = 4;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_d8,"cutOffAngle");
                      if (bVar1) {
                        direction.y = XML_ReadNode_GetAttrVal_AsFloat(this,an.field_2._12_4_);
                        local_e0 = 4;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_d8,"direction");
                        if (bVar1) {
                          XML_ReadNode_GetAttrVal_AsVec3f
                                    (this,an.field_2._12_4_,(aiVector3D *)&intensity);
                          local_e0 = 4;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"global");
                          if (bVar1) {
                            location.z._3_1_ =
                                 XML_ReadNode_GetAttrVal_AsBool(this,an.field_2._12_4_);
                            local_e0 = 4;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"intensity");
                            if (bVar1) {
                              location.y = XML_ReadNode_GetAttrVal_AsFloat(this,an.field_2._12_4_);
                              local_e0 = 4;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"location");
                              if (bVar1) {
                                XML_ReadNode_GetAttrVal_AsVec3f
                                          (this,an.field_2._12_4_,(aiVector3D *)&radius);
                                local_e0 = 4;
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"on");
                                if (bVar1) {
                                  ne._7_1_ = XML_ReadNode_GetAttrVal_AsBool(this,an.field_2._12_4_);
                                  local_e0 = 4;
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"radius");
                                  if (bVar1) {
                                    ne._0_4_ = XML_ReadNode_GetAttrVal_AsFloat
                                                         (this,an.field_2._12_4_);
                                    local_e0 = 4;
                                  }
                                  else {
                                    Throw_IncorrectAttr(this,(string *)local_d8);
                                    local_e0 = 0;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_d8);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)&attenuation.z,ENET_SpotLight,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)&attenuation.z);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else if ((ne._7_1_ & 1) != 0) {
    pCVar6 = (CX3DImporter_NodeElement_Light *)operator_new(0x98);
    CX3DImporter_NodeElement_Light::CX3DImporter_NodeElement_Light
              (pCVar6,ENET_SpotLight,this->NodeElement_Cur);
    _idx_end = pCVar6;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,
                 (string *)(use.field_2._M_local_buf + 8));
    }
    if (direction.y < color.g) {
      color.g = direction.y;
    }
    _idx_end->AmbientIntensity = attenuation.y;
    (_idx_end->Attenuation).z = attenuation.x;
    (_idx_end->Attenuation).x = (float)local_60._0_4_;
    (_idx_end->Attenuation).y = (float)local_60._4_4_;
    _idx_end->BeamWidth = color.g;
    aiColor3D::operator=(&_idx_end->Color,(aiColor3D *)&direction.z);
    _idx_end->CutOffAngle = direction.y;
    (_idx_end->Direction).z = direction.x;
    (_idx_end->Direction).x = intensity;
    (_idx_end->Direction).y = fStack_88;
    _idx_end->Global = (bool)(location.z._3_1_ & 1);
    _idx_end->Intensity = location.y;
    (_idx_end->Location).z = location.x;
    (_idx_end->Location).x = radius;
    (_idx_end->Location).y = fStack_9c;
    _idx_end->Radius = ne._0_4_;
    ParseHelper_Group_Begin(this,false);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      to_string<unsigned_long>(&local_120,(unsigned_long)_idx_end);
      std::operator+(&local_100,"SpotLight_",&local_120);
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
    }
    std::__cxx11::string::operator=
              ((string *)&this->NodeElement_Cur->ID,
               (string *)&(_idx_end->super_CX3DImporter_NodeElement).ID);
    ParseHelper_Node_Exit(this);
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar6 = _idx_end;
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"SpotLight",&local_141);
      ParseNode_Metadata(this,&pCVar6->super_CX3DImporter_NodeElement,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::__cxx11::string::~string((string *)&attenuation.z);
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Lighting_SpotLight()
{
    std::string def, use;
    float ambientIntensity = 0;
    aiVector3D attenuation( 1, 0, 0 );
    float beamWidth = 0.7854f;
    aiColor3D color( 1, 1, 1 );
    float cutOffAngle = 1.570796f;
    aiVector3D direction( 0, 0, -1 );
    bool global = true;
    float intensity = 1;
    aiVector3D location( 0, 0, 0 );
    bool on = true;
    float radius = 100;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ambientIntensity", ambientIntensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("attenuation", attenuation, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_RET("beamWidth", beamWidth, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("color", color, XML_ReadNode_GetAttrVal_AsCol3f);
		MACRO_ATTRREAD_CHECK_RET("cutOffAngle", cutOffAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("direction", direction, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_RET("global", global, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("intensity", intensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("location", location, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_RET("on", on, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_SpotLight, ne);
	}
	else
	{
		if(on)
		{
			// create and if needed - define new geometry object.
			ne = new CX3DImporter_NodeElement_Light(CX3DImporter_NodeElement::ENET_SpotLight, NodeElement_Cur);
			if(!def.empty()) ne->ID = def;

			if(beamWidth > cutOffAngle) beamWidth = cutOffAngle;

			((CX3DImporter_NodeElement_Light*)ne)->AmbientIntensity = ambientIntensity;
			((CX3DImporter_NodeElement_Light*)ne)->Attenuation = attenuation;
			((CX3DImporter_NodeElement_Light*)ne)->BeamWidth = beamWidth;
			((CX3DImporter_NodeElement_Light*)ne)->Color = color;
			((CX3DImporter_NodeElement_Light*)ne)->CutOffAngle = cutOffAngle;
			((CX3DImporter_NodeElement_Light*)ne)->Direction = direction;
			((CX3DImporter_NodeElement_Light*)ne)->Global = global;
			((CX3DImporter_NodeElement_Light*)ne)->Intensity = intensity;
			((CX3DImporter_NodeElement_Light*)ne)->Location = location;
			((CX3DImporter_NodeElement_Light*)ne)->Radius = radius;

			// Assimp want a node with name similar to a light. "Why? I don't no." )
			ParseHelper_Group_Begin(false);
			// make random name
			if(ne->ID.empty()) ne->ID = "SpotLight_" + to_string((size_t)ne);

			NodeElement_Cur->ID = ne->ID;// assign name to node and return to light element.
			ParseHelper_Node_Exit();
			// check for child nodes
			if(!mReader->isEmptyElement())
				ParseNode_Metadata(ne, "SpotLight");
			else
				NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

			NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
		}// if(on)
	}// if(!use.empty()) else
}